

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.hpp
# Opt level: O0

void __thiscall antlr::InputBuffer::reset(InputBuffer *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  CircularQueue<int>::clear((CircularQueue<int> *)0x1ed367);
  return;
}

Assistant:

virtual inline void reset( void )
	{
		nMarkers = 0;
		markerOffset = 0;
		numToConsume = 0;
		queue.clear();
	}